

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mput.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *__stream;
  void *__ptr;
  size_t sVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar5;
  char *pcVar6;
  size_t nc;
  int i;
  char *buf;
  FILE *fp;
  undefined1 local_90 [8];
  ufile_mutipart_state state;
  ufile_error error;
  ufile_config cfg;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    printf(anon_var_dwarf_23);
    exit(1);
  }
  pcVar2 = getenv("UFILE_PUBLIC_KEY");
  pcVar3 = getenv("UFILE_PRIVATE_KEY");
  printf(anon_var_dwarf_8d);
  pcVar5 = "cn-bj.ufileos.com";
  pcVar6 = "api.ucloud.cn";
  state.curls._0_4_ = ufile_sdk_initialize(0);
  if (((int)state.curls == 0) || ((int)state.curls / 100 == 2)) {
    printf(anon_var_dwarf_b9);
    iVar1 = ufile_multiple_upload_init
                      (local_90,"echotest2","multiple_upload",anon_var_dwarf_8d + 0x1b,in_R8,in_R9,
                       pcVar2,pcVar3,pcVar5,pcVar6);
    if ((iVar1 == 0) || (iVar1 / 100 == 2)) {
      __stream = fopen(argv[1],"rb");
      __ptr = malloc((size_t)state.mime_type);
      nc._4_4_ = 0;
      while (sVar4 = fread(__ptr,1,(size_t)state.mime_type,__stream), sVar4 != 0) {
        iVar1 = ufile_multiple_upload_part(local_90,__ptr,sVar4,nc._4_4_);
        if ((iVar1 != 0) && (iVar1 / 100 != 2)) {
          printf(anon_var_dwarf_13d,iVar1,extraout_RDX_01);
          ufile_multiple_upload_abort(local_90);
          ufile_sdk_cleanup();
          return 1;
        }
        nc._4_4_ = nc._4_4_ + 1;
      }
      iVar1 = ufile_multiple_upload_finish(local_90);
      if ((iVar1 == 0) || (iVar1 / 100 == 2)) {
        printf(anon_var_dwarf_15d);
      }
      else {
        printf(anon_var_dwarf_147,extraout_RDX_02,(long)iVar1 % 100 & 0xffffffff);
      }
      ufile_sdk_cleanup();
      argv_local._4_4_ = 0;
    }
    else {
      ufile_sdk_cleanup();
      printf(anon_var_dwarf_111,iVar1,extraout_RDX_00);
      argv_local._4_4_ = 1;
    }
  }
  else {
    ufile_sdk_cleanup();
    printf(anon_var_dwarf_a3,extraout_RDX);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]){
    if(argc < 2){
        printf("请输入一个文件路径！！！！");
        exit(1);
    }
    struct ufile_config cfg;
    cfg.public_key = getenv("UFILE_PUBLIC_KEY");
    cfg.private_key = getenv("UFILE_PRIVATE_KEY");
    cfg.bucket_host = "api.ucloud.cn";
    cfg.file_host = "cn-bj.ufileos.com";

    printf("正在初始化 SDK ......\n");
    struct ufile_error error;
    error = ufile_sdk_initialize(cfg, 0);
    if(UFILE_HAS_ERROR(error.code)){
        ufile_sdk_cleanup();
        printf("初始化 sdk 失败，错误信息为：%s\n", error.message);
        return 1;
    }

    printf("调用 (mput)分片 上传文件.....\n");
    struct ufile_mutipart_state state;
    error = ufile_multiple_upload_init(&state, "echotest2", "multiple_upload", "");
    if(UFILE_HAS_ERROR(error.code)){
        ufile_sdk_cleanup();
        printf("调用 ufile_multiple_upload_init 失败，错误信息为：%d, %s\n", error.code, error.message);
        return 1;
    }

    FILE *fp = fopen(argv[1], "rb");
    char *buf = malloc(state.part_size);
    int i;
    for(i=0; ; i++){
        size_t nc = fread(buf, 1, state.part_size, fp);
        if(nc == 0){
            break;
        }
        error = ufile_multiple_upload_part(&state, buf, nc, i);
        if(UFILE_HAS_ERROR(error.code)){
            printf("调用 ufile_multiple_upload_part 失败，错误信息为：%d, %s\n", error.code, error.message);
            ufile_multiple_upload_abort(&state);
            ufile_sdk_cleanup();
            return 1;
        }
    }

    error = ufile_multiple_upload_finish(&state);
    if(UFILE_HAS_ERROR(error.code)){
        printf("调用 ufile_multiple_upload_part 失败，错误信息为：%s\n", error.message);
    }else{
        printf("调用 (mput)分片上传成功\n");
    }
    ufile_sdk_cleanup();
    return 0;
}